

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarySearch.cpp
# Opt level: O0

void ReadFile(string *fileName,vector<int,_std::allocator<int>_> *retVector)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  int local_234;
  char local_22d;
  char inChar;
  char local_220 [8];
  ifstream input;
  vector<int,_std::allocator<int>_> *retVector_local;
  string *fileName_local;
  
  std::ifstream::ifstream(local_220);
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::open(local_220,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (iVar2 = std::istream::peek(), iVar2 != -1) {
      std::istream::get(local_220);
      iVar2 = isdigit((int)local_22d);
      if (iVar2 != 0) {
        local_234 = local_22d + -0x30;
        std::vector<int,_std::allocator<int>_>::push_back(retVector,&local_234);
      }
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void ReadFile(std::string fileName, std::vector<int> *retVector)
{
    std::ifstream input;


    input.open(fileName.c_str());

    if(input.is_open())
    {
        while(input.peek() != EOF)
        {
            char inChar;
            input.get(inChar);

            if(isdigit(inChar))
            {
                retVector->push_back(inChar - 48);
            }
        }
    }

    input.close();
}